

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O3

void __thiscall CWire::Delete(CWire *this)

{
  CWire *local_10;
  
  if ((this->super_CObject).m_pParent == (CObject *)0x0) {
    (this->super_CObject).m_Key = 0;
    (this->super_CObject).m_iProp = 0;
    (this->super_CObject).m_iState = 0;
    this->m_pPointE = (CPoint *)0x0;
    this->m_pPointS = (CPoint *)0x0;
    ClearSegmentList(this);
    if (m_InstancePool.c.super__Deque_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        m_InstancePool.c.super__Deque_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      local_10 = this;
      std::deque<CWire*,std::allocator<CWire*>>::_M_push_back_aux<CWire*>
                ((deque<CWire*,std::allocator<CWire*>> *)&m_InstancePool,&local_10);
    }
    else {
      *m_InstancePool.c.super__Deque_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = this;
      m_InstancePool.c.super__Deque_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           m_InstancePool.c.super__Deque_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 1;
    }
    return;
  }
  __assert_fail("m_pParent==NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x2a5,"void CWire::Delete()");
}

Assistant:

void CWire::Delete()
{
	assert(m_pParent==NULL);
	m_iState	=	STATE_INVALID;
	m_iProp		=	PROP_INVALID;
	m_Key		=	0;

	m_pPointE	=	NULL;
	m_pPointS	=	NULL;

	ClearSegmentList();
	m_InstancePool.push(this);
}